

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::rfind(StringPiece *this,StringPiece s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  
  lVar3 = s.length_;
  uVar1 = this->length_;
  if ((long)uVar1 < lVar3) {
    pos = 0xffffffffffffffff;
  }
  else if (lVar3 == 0) {
    if (uVar1 < pos) {
      pos = uVar1;
    }
  }
  else {
    if (uVar1 - lVar3 < pos) {
      pos = uVar1 - lVar3;
    }
    pcVar4 = this->ptr_ + lVar3 + pos;
    pcVar2 = std::__find_end<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (this->ptr_,pcVar4,s.ptr_,s.ptr_ + lVar3);
    pos = 0xffffffffffffffff;
    if (pcVar2 != pcVar4) {
      pos = (long)pcVar2 - (long)this->ptr_;
    }
  }
  return pos;
}

Assistant:

stringpiece_ssize_type StringPiece::rfind(StringPiece s, size_type pos) const {
  if (length_ < s.length_) return npos;
  const size_t ulen = length_;
  if (s.length_ == 0) return std::min(ulen, pos);

  const char* last = ptr_ + std::min(ulen - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}